

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O2

vector<int,_std::allocator<int>_> *
polyscope::gather<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<int,_std::allocator<int>_> *input,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *perm)

{
  pointer puVar1;
  pointer puVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  allocator_type local_19;
  
  lVar5 = (long)(perm->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(perm->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 == 0) {
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,input);
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,lVar5 >> 2,&local_19);
    puVar1 = (perm->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (perm->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    piVar3 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar5 = 0; (long)puVar2 - (long)puVar1 >> 2 != lVar5; lVar5 = lVar5 + 1) {
      piVar4[lVar5] = piVar3[puVar1[lVar5]];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gather(const std::vector<T>& input, const std::vector<uint32_t>& perm) {
  // TODO figure out if there's a copy to be avoided here
  if (perm.size() == 0) {
    return input;
  }
  std::vector<T> result(perm.size());
  for (size_t i = 0; i < perm.size(); i++) {
    result[i] = input[perm[i]];
  }
  return result;
}